

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# include.hpp
# Opt level: O0

int base_to_int(uchar c)

{
  undefined1 in_DIL;
  int local_4;
  
  switch(in_DIL) {
  case 0x41:
  case 0x61:
    local_4 = 0;
    break;
  default:
    local_4 = 0;
    break;
  case 0x43:
  case 99:
    local_4 = 1;
    break;
  case 0x47:
  case 0x67:
    local_4 = 2;
    break;
  case 0x4e:
  case 0x6e:
    local_4 = rand();
    local_4 = local_4 % 4;
    break;
  case 0x54:
  case 0x74:
    local_4 = 3;
  }
  return local_4;
}

Assistant:

int base_to_int(unsigned char c){

	switch(c){

		case 'A': case 'a': return 0; break;
		case 'C': case 'c': return 1; break;
		case 'G': case 'g': return 2; break;
		case 'T': case 't': return 3; break;
		case 'N': case 'n': return rand()%4; break;

	}

	return 0;

}